

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

word Acb_ComputeFunction(sat_solver *pSat,int PivotVar,int FreeVar,Vec_Int_t *vDivVars,int fCompl)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int Entry;
  uint uVar4;
  Vec_Int_t *p;
  ulong uVar5;
  ulong local_50;
  int pLits [2];
  Vec_Int_t *local_40;
  sat_solver *local_38;
  
  local_40 = Vec_IntAlloc(100);
  iVar1 = sat_solver_nvars(pSat);
  if (iVar1 <= FreeVar) {
    __assert_fail("FreeVar < sat_solver_nvars(pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                  ,0x161,"word Acb_ComputeFunction(sat_solver *, int, int, Vec_Int_t *, int)");
  }
  pLits[0] = Abc_Var2Lit(PivotVar,fCompl);
  local_50 = 0;
  pLits[1] = Abc_Var2Lit(FreeVar,0);
  p = local_40;
  local_38 = pSat;
  do {
    iVar1 = sat_solver_solve(pSat,pLits,(lit *)&local_40,0,0,0,0);
    if (iVar1 != 1) {
      if (iVar1 != -1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                      ,0x170,"word Acb_ComputeFunction(sat_solver *, int, int, Vec_Int_t *, int)");
      }
      break;
    }
    iVar1 = Abc_LitNot(pLits[1]);
    Vec_IntFill(p,1,iVar1);
    for (iVar1 = 0; iVar1 < vDivVars->nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(vDivVars,iVar1);
      iVar2 = sat_solver_var_literal(pSat,iVar2);
      iVar2 = Abc_LitNot(iVar2);
      Vec_IntPush(p,iVar2);
    }
    iVar1 = p->nSize;
    uVar5 = 0xffffffffffffffff;
    for (iVar2 = 1; pSat = local_38, iVar2 < iVar1; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(p,iVar2);
      Entry = Abc_Lit2Var(iVar3);
      uVar4 = Vec_IntFind(vDivVars,Entry);
      if ((int)uVar4 < 0) {
        __assert_fail("iVar >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                      ,0x18d,"word Acb_ComputeFunction(sat_solver *, int, int, Vec_Int_t *, int)");
      }
      iVar3 = Abc_LitIsCompl(iVar3);
      uVar5 = uVar5 & ((long)(iVar3 + -1) ^ s_Truths6[uVar4]);
      p = local_40;
    }
    local_50 = local_50 | uVar5;
    iVar1 = sat_solver_addclause(local_38,p->pArray,p->pArray + iVar1);
  } while (iVar1 != 0);
  Vec_IntFree(p);
  return local_50;
}

Assistant:

word Acb_ComputeFunction( sat_solver * pSat, int PivotVar, int FreeVar, Vec_Int_t * vDivVars, int fCompl )
{
    int fExpand = 0;
    word uCube, uTruth = 0;
    Vec_Int_t * vTempLits = Vec_IntAlloc( 100 );
    int status, i, iVar, iLit, nFinal, * pFinal, pLits[2];
    assert( FreeVar < sat_solver_nvars(pSat) );
//    if ( fCompl )
//        pLits[0] = Abc_Var2Lit( sat_solver_nvars(pSat)-2, 0 ); // F = 1
//    else
        pLits[0] = Abc_Var2Lit( PivotVar, fCompl ); // F = 1
    pLits[1] = Abc_Var2Lit( FreeVar, 0 );  // iNewLit
    while ( 1 ) 
    {
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
        if ( status == l_False )
        {
            Vec_IntFree( vTempLits );
            return uTruth;
        }
        assert( status == l_True );
        if ( fExpand )
        {
            // collect divisor literals
            Vec_IntFill( vTempLits, 1, Abc_LitNot(pLits[0]) ); // F = 0
            Vec_IntForEachEntry( vDivVars, iVar, i )
                Vec_IntPush( vTempLits, sat_solver_var_literal(pSat, iVar) );
            // check against offset
            status = sat_solver_solve( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits), 0, 0, 0, 0 );
            if ( status != l_False )
                printf( "Failed internal check during function comptutation.\n" );
            assert( status == l_False );
            // compute cube and add clause
            nFinal = sat_solver_final( pSat, &pFinal );
            Vec_IntFill( vTempLits, 1, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
            for ( i = 0; i < nFinal; i++ )
                if ( pFinal[i] != pLits[0] )
                    Vec_IntPush( vTempLits, pFinal[i] );
        }
        else
        {
            // collect divisor literals
            Vec_IntFill( vTempLits, 1, Abc_LitNot(pLits[1]) );// NOT(iNewLit)
            Vec_IntForEachEntry( vDivVars, iVar, i )
                Vec_IntPush( vTempLits, Abc_LitNot(sat_solver_var_literal(pSat, iVar)) );
        }
        uCube = ~(word)0;
        Vec_IntForEachEntryStart( vTempLits, iLit, i, 1 )
        {
            iVar = Vec_IntFind( vDivVars, Abc_Lit2Var(iLit) );   assert( iVar >= 0 );
            uCube &= Abc_LitIsCompl(iLit) ? s_Truths6[iVar] : ~s_Truths6[iVar];
        }
        uTruth |= uCube;
        status = sat_solver_addclause( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits) );
        if ( status == 0 )
        {
            Vec_IntFree( vTempLits );
            return uTruth;
        }
    }
    Vec_IntFree( vTempLits );
    assert( 0 ); 
    return ~(word)0;
}